

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,std::vector<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>>,std::vector<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>>>
          (ResultBuilder *this,
          vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
          *lhs,vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
               *rhs)

{
  bool bVar1;
  ContextOptions *pCVar2;
  vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
  *in_R8;
  String SStack_38;
  
  bVar1 = std::operator==(lhs,rhs);
  (this->super_AssertData).m_failed = !bVar1;
  if ((bVar1) && (pCVar2 = getContextOptions(), pCVar2->success != true)) {
    return;
  }
  stringifyBinaryExpr<std::vector<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>>,std::vector<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,std::allocator<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>>>
            (&SStack_38,(detail *)lhs,
             (vector<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>,_std::allocator<supermap::KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_>_>_>
              *)0x1a184a,(char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }